

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

RECORD_TYPE ON_HistoryRecord::RecordType(int i)

{
  undefined4 local_c;
  int i_local;
  
  if (i == 0) {
    local_c = history_parameters;
  }
  else if (i == 1) {
    local_c = feature_parameters;
  }
  else {
    local_c = history_parameters;
  }
  return local_c;
}

Assistant:

ON_HistoryRecord::RECORD_TYPE ON_HistoryRecord::RecordType(int i)
{
  switch (i)
  {
  case (int)ON_HistoryRecord::RECORD_TYPE::history_parameters:
    return ON_HistoryRecord::RECORD_TYPE::history_parameters;

  case (int)ON_HistoryRecord::RECORD_TYPE::feature_parameters:
    return ON_HistoryRecord::RECORD_TYPE::feature_parameters;
  }

  return ON_HistoryRecord::RECORD_TYPE::history_parameters;
}